

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::GetImplibGNUtoMS
          (cmGeneratorTarget *this,string *config,string *gnuName,string *out,char *newExt)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  char *local_c0;
  bool local_91;
  string local_90 [55];
  byte local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char *local_38;
  char *newExt_local;
  string *out_local;
  string *gnuName_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  local_38 = newExt;
  newExt_local = (char *)out;
  out_local = gnuName;
  gnuName_local = config;
  config_local = (string *)this;
  bVar2 = HasImplibGNUtoMS(this,config);
  local_59 = 0;
  local_91 = false;
  if (bVar2) {
    uVar3 = std::__cxx11::string::size();
    psVar1 = out_local;
    local_91 = false;
    if (6 < uVar3) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)&local_58,(ulong)psVar1);
      local_59 = 1;
      local_91 = std::operator==(&local_58,".dll.a");
    }
  }
  if ((local_59 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  psVar1 = out_local;
  if (local_91 == false) {
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_90,(ulong)psVar1);
    std::__cxx11::string::operator=((string *)newExt_local,local_90);
    std::__cxx11::string::~string(local_90);
    if (local_38 == (char *)0x0) {
      local_c0 = ".lib";
    }
    else {
      local_c0 = local_38;
    }
    std::__cxx11::string::operator+=((string *)newExt_local,local_c0);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::GetImplibGNUtoMS(std::string const& config,
                                         std::string const& gnuName,
                                         std::string& out,
                                         const char* newExt) const
{
  if (this->HasImplibGNUtoMS(config) && gnuName.size() > 6 &&
      gnuName.substr(gnuName.size() - 6) == ".dll.a") {
    out = gnuName.substr(0, gnuName.size() - 6);
    out += newExt ? newExt : ".lib";
    return true;
  }
  return false;
}